

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O0

void __thiscall KeyData_Pubkey1_Test::TestBody(KeyData_Pubkey1_Test *this)

{
  allocator<unsigned_int> *this_00;
  initializer_list<unsigned_int> __l;
  undefined1 local_410 [8];
  KeyData obj2;
  string local_280;
  undefined1 local_260 [8];
  KeyData obj1;
  anon_class_1_0_00000001 check_func;
  undefined1 local_b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> array1;
  string local_98;
  undefined1 local_78 [8];
  ByteData fingerprint1;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey pubkey1;
  KeyData_Pubkey1_Test *this_local;
  
  pubkey1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"12345678",
             (allocator *)
             ((long)&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  obj1.fingerprint_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this_00 = (allocator<unsigned_int> *)
            ((long)&obj1.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = 3;
  __l._M_array = (iterator)
                 ((long)&obj1.fingerprint_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,__l,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_280,"0/1/2",
             (allocator *)
             ((long)&obj2.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::KeyData::KeyData
            ((KeyData *)local_260,(Pubkey *)local_28,&local_280,(ByteData *)local_78);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&obj2.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 2),(KeyData *)local_260,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  cfd::core::KeyData::KeyData
            ((KeyData *)local_410,(Pubkey *)local_28,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,(ByteData *)local_78);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 2),(KeyData *)local_410,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  cfd::core::KeyData::~KeyData((KeyData *)local_410);
  cfd::core::KeyData::~KeyData((KeyData *)local_260);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  cfd::core::ByteData::~ByteData((ByteData *)local_78);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(KeyData, Pubkey1) {
  Pubkey pubkey1("021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647");
  ByteData fingerprint1("12345678");
  std::vector<uint32_t> array1{0, 1, 2};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_FALSE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("0/1/2", obj.GetBip32Path().c_str());
    EXPECT_STREQ("12345678", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[12345678/0/1/2]021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
        obj.ToString().c_str());
    EXPECT_STREQ("0x0/0x1/0x2",
        obj.GetBip32Path(HardenedType::kApostrophe, true).c_str());
  };

  KeyData obj1(pubkey1, "0/1/2", fingerprint1);
  check_func(obj1, array1);
  KeyData obj2(pubkey1, array1, fingerprint1);
  check_func(obj2, array1);
}